

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O2

void do_surrender(CHAR_DATA *ch,char *argument)

{
  CHAR_DATA *arg2;
  
  arg2 = ch->fighting;
  if (arg2 != (CHAR_DATA *)0x0) {
    act("You surrender to $N!",ch,(void *)0x0,arg2,3);
    act("$n surrenders to you!",ch,(void *)0x0,arg2,2);
    act("$n tries to surrender to $N!",ch,(void *)0x0,arg2,1);
    stop_fighting(ch,true);
    return;
  }
  send_to_char("But you\'re not fighting!\n\r",ch);
  return;
}

Assistant:

void do_surrender(CHAR_DATA *ch, char *argument)
{
	CHAR_DATA *mob = ch->fighting;

	if (mob == nullptr)
	{
		send_to_char("But you're not fighting!\n\r", ch);
		return;
	}

	act("You surrender to $N!", ch, nullptr, mob, TO_CHAR);
	act("$n surrenders to you!", ch, nullptr, mob, TO_VICT);
	act("$n tries to surrender to $N!", ch, nullptr, mob, TO_NOTVICT);
	stop_fighting(ch, true);
}